

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_pts_landmarks.hpp
# Opt level: O2

LandmarkCollection<Eigen::Vector2f> *
eos::core::read_pts_landmarks
          (LandmarkCollection<Eigen::Vector2f> *__return_storage_ptr__,string *filename)

{
  bool bVar1;
  istream *piVar2;
  runtime_error *prVar3;
  int __val;
  float fVar4;
  Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_> landmark;
  string line;
  string local_3e0;
  ifstream file;
  byte abStack_3a0 [488];
  stringstream lineStream;
  
  (__return_storage_ptr__->
  super__Vector_base<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
  ::reserve(__return_storage_ptr__,0x44);
  std::ifstream::ifstream(&file,(string *)filename,_S_in);
  if ((abStack_3a0[*(long *)(_file + -0x18)] & 5) != 0) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&lineStream,
                   "Could not open landmark file: ",filename);
    std::runtime_error::runtime_error(prVar3,(string *)&lineStream);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&file,(string *)&line);
  std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&file,(string *)&line);
  std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&file,(string *)&line);
  __val = 1;
  while( true ) {
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&file,(string *)&line);
    if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) break;
    bVar1 = std::operator==(&line,"}");
    if (bVar1) break;
    std::__cxx11::stringstream::stringstream
              ((stringstream *)&lineStream,(string *)&line,_S_out|_S_in);
    landmark.name._M_dataplus._M_p = (pointer)&landmark.name.field_2;
    landmark.name._M_string_length = 0;
    landmark.name.field_2._M_local_buf[0] = '\0';
    std::__cxx11::to_string(&local_3e0,__val);
    std::__cxx11::string::operator=((string *)&landmark,(string *)&local_3e0);
    std::__cxx11::string::~string((string *)&local_3e0);
    piVar2 = std::istream::_M_extract<float>((float *)&lineStream);
    piVar2 = std::istream::_M_extract<float>((float *)piVar2);
    if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) {
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+(&local_3e0,"Landmark format error while parsing the line: ",&line);
      std::runtime_error::runtime_error(prVar3,(string *)&local_3e0);
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    fVar4 = landmark.coordinates.super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.
            m_storage.m_data.array[0];
    landmark.coordinates.super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.
    m_data.array[1] =
         landmark.coordinates.super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.
         m_data.array[1] + -1.0;
    landmark.coordinates.super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.
    m_data.array[0] = fVar4 + -1.0;
    std::
    vector<eos::core::Landmark<Eigen::Matrix<float,2,1,0,2,1>>,std::allocator<eos::core::Landmark<Eigen::Matrix<float,2,1,0,2,1>>>>
    ::emplace_back<eos::core::Landmark<Eigen::Matrix<float,2,1,0,2,1>>&>
              ((vector<eos::core::Landmark<Eigen::Matrix<float,2,1,0,2,1>>,std::allocator<eos::core::Landmark<Eigen::Matrix<float,2,1,0,2,1>>>>
                *)__return_storage_ptr__,&landmark);
    __val = __val + 1;
    std::__cxx11::string::~string((string *)&landmark);
    std::__cxx11::stringstream::~stringstream((stringstream *)&lineStream);
  }
  std::__cxx11::string::~string((string *)&line);
  std::ifstream::~ifstream(&file);
  return __return_storage_ptr__;
}

Assistant:

inline LandmarkCollection<Eigen::Vector2f> read_pts_landmarks(std::string filename)
{
    using Eigen::Vector2f;
    using std::getline;
    using std::string;
    LandmarkCollection<Vector2f> landmarks;
    landmarks.reserve(68);

    std::ifstream file(filename);
    if (!file)
    {
        throw std::runtime_error(string("Could not open landmark file: " + filename));
    }

    string line;
    // Skip the first 3 lines, they're header lines:
    getline(file, line); // 'version: 1'
    getline(file, line); // 'n_points : 68'
    getline(file, line); // '{'

    int ibugId = 1;
    while (getline(file, line))
    {
        if (line == "}")
        { // end of the file
            break;
        }
        std::stringstream lineStream(line);

        Landmark<Vector2f> landmark;
        landmark.name = std::to_string(ibugId);
        if (!(lineStream >> landmark.coordinates[0] >> landmark.coordinates[1]))
        {
            throw std::runtime_error(string("Landmark format error while parsing the line: " + line));
        }
        // From the iBug website:
        // "Please note that the re-annotated data for this challenge are saved in the Matlab convention of 1
        // being the first index, i.e. the coordinates of the top left pixel in an image are x=1, y=1."
        // ==> So we shift every point by 1:
        landmark.coordinates[0] -= 1.0f;
        landmark.coordinates[1] -= 1.0f;
        landmarks.emplace_back(landmark);
        ++ibugId;
    }
    return landmarks;
}